

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O0

uint32_t helper_atomic_xchgl_be_ppc64
                   (CPUArchState_conflict21 *env,target_ulong addr,uint32_t val,TCGMemOpIdx oi)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  uintptr_t unaff_retaddr;
  uint32_t ret;
  uint32_t *haddr;
  TCGMemOpIdx oi_local;
  uint32_t val_local;
  target_ulong addr_local;
  CPUArchState_conflict21 *env_local;
  
  puVar3 = (uint32_t *)atomic_mmu_lookup(env,addr,oi,unaff_retaddr);
  uVar2 = *puVar3;
  uVar1 = bswap32(val);
  *puVar3 = uVar1;
  uVar2 = bswap32(uVar2);
  return uVar2;
}

Assistant:

ABI_TYPE ATOMIC_NAME(xchg)(CPUArchState *env, target_ulong addr,
                           ABI_TYPE val EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    ABI_TYPE ret;
    ret = *haddr;
    *haddr = BSWAP(val);
    ATOMIC_MMU_CLEANUP;
    return BSWAP(ret);
}